

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O2

int mbedtls_arc4_crypt(mbedtls_arc4_context *ctx,size_t length,uchar *input,uchar *output)

{
  uchar uVar1;
  uchar uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar3 = (ulong)(uint)ctx->x;
  uVar4 = (ulong)(uint)ctx->y;
  for (sVar5 = 0; length != sVar5; sVar5 = sVar5 + 1) {
    uVar3 = (ulong)((int)uVar3 + 1U & 0xff);
    uVar1 = ctx->m[uVar3];
    uVar4 = (ulong)(byte)((char)uVar4 + uVar1);
    uVar2 = ctx->m[uVar4];
    ctx->m[uVar3] = uVar2;
    ctx->m[uVar4] = uVar1;
    output[sVar5] = ctx->m[(byte)(uVar2 + uVar1)] ^ input[sVar5];
  }
  ctx->x = (int)uVar3;
  ctx->y = (int)uVar4;
  return 0;
}

Assistant:

int mbedtls_arc4_crypt( mbedtls_arc4_context *ctx, size_t length, const unsigned char *input,
                unsigned char *output )
{
    int x, y, a, b;
    size_t i;
    unsigned char *m;

    x = ctx->x;
    y = ctx->y;
    m = ctx->m;

    for( i = 0; i < length; i++ )
    {
        x = ( x + 1 ) & 0xFF; a = m[x];
        y = ( y + a ) & 0xFF; b = m[y];

        m[x] = (unsigned char) b;
        m[y] = (unsigned char) a;

        output[i] = (unsigned char)
            ( input[i] ^ m[(unsigned char)( a + b )] );
    }

    ctx->x = x;
    ctx->y = y;

    return( 0 );
}